

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderStairs<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLogLin>
               (GetterXsYs<unsigned_long_long> *getter,TransformerLogLin *transformer,
               ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  ImVec2 IVar4;
  ImPlotPlot *pIVar5;
  double dVar6;
  ImPlotContext *pIVar7;
  ImPlotContext *pIVar8;
  ImDrawList *this;
  long lVar9;
  int iVar10;
  int iVar11;
  ImPlotContext *gp;
  double dVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ImVec2 p12;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_90;
  double local_88;
  double dStack_80;
  ImDrawList *local_70;
  ImVec2 local_68;
  TransformerLogLin *local_60;
  undefined1 local_58 [8];
  TransformerLogLin *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar7 = GImPlot;
  pIVar5 = GImPlot->CurrentPlot;
  local_70 = DrawList;
  if (((pIVar5->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar10 = getter->Count;
    local_48 = iVar10 + -1;
    local_40 = line_weight * 0.5;
    lVar9 = (long)((getter->Offset % iVar10 + iVar10) % iVar10) * (long)getter->Stride;
    uVar2 = *(unsigned_long_long *)((long)getter->Xs + lVar9);
    uVar3 = *(unsigned_long_long *)((long)getter->Ys + lVar9);
    dStack_80 = (double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25;
    local_88 = dStack_80 + ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
    dStack_80 = dStack_80 + dStack_80;
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    dVar12 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                   (pIVar5->XAxis).Range.Min);
    pIVar5 = pIVar7->CurrentPlot;
    dVar6 = (pIVar5->XAxis).Range.Min;
    iVar10 = transformer->YAxis;
    IVar4 = pIVar7->PixelRange[iVar10].Min;
    local_3c.x = (float)(pIVar7->Mx *
                         (((double)(float)(dVar12 / pIVar7->LogDenX) *
                           ((pIVar5->XAxis).Range.Max - dVar6) + dVar6) - dVar6) + (double)IVar4.x);
    local_3c.y = (float)(pIVar7->My[iVar10] * (local_88 - pIVar5->YAxis[iVar10].Range.Min) +
                        (double)IVar4.y);
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLogLin>>
              ((StairsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLogLin> *)
               local_58,local_70,&pIVar5->PlotRect);
  }
  else {
    iVar10 = getter->Count;
    lVar9 = (long)((getter->Offset % iVar10 + iVar10) % iVar10) * (long)getter->Stride;
    uVar2 = *(unsigned_long_long *)((long)getter->Xs + lVar9);
    uVar3 = *(unsigned_long_long *)((long)getter->Ys + lVar9);
    dStack_80 = (double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25;
    local_88 = dStack_80 + ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
    dStack_80 = dStack_80 + dStack_80;
    dVar12 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                   (pIVar5->XAxis).Range.Min);
    pIVar5 = pIVar7->CurrentPlot;
    dVar6 = (pIVar5->XAxis).Range.Min;
    iVar10 = transformer->YAxis;
    IVar4 = pIVar7->PixelRange[iVar10].Min;
    local_58._0_4_ =
         (undefined4)
         (pIVar7->Mx *
          (((double)(float)(dVar12 / pIVar7->LogDenX) * ((pIVar5->XAxis).Range.Max - dVar6) + dVar6)
          - dVar6) + (double)IVar4.x);
    local_58._4_4_ =
         (undefined4)
         (pIVar7->My[iVar10] * (local_88 - pIVar5->YAxis[iVar10].Range.Min) + (double)IVar4.y);
    iVar10 = getter->Count;
    if (1 < iVar10) {
      iVar11 = 1;
      local_60 = transformer;
      do {
        pIVar8 = GImPlot;
        lVar9 = (long)(((getter->Offset + iVar11) % iVar10 + iVar10) % iVar10) *
                (long)getter->Stride;
        uVar2 = *(unsigned_long_long *)((long)getter->Xs + lVar9);
        uVar3 = *(unsigned_long_long *)((long)getter->Ys + lVar9);
        dStack_80 = (double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25;
        local_88 = dStack_80 + ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
        dStack_80 = dStack_80 + dStack_80;
        dVar12 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25)
                       + ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        this = local_70;
        pIVar5 = pIVar8->CurrentPlot;
        dVar6 = (pIVar5->XAxis).Range.Min;
        iVar10 = transformer->YAxis;
        IVar4 = pIVar8->PixelRange[iVar10].Min;
        fVar13 = (float)(pIVar8->Mx *
                         (((double)(float)(dVar12 / pIVar8->LogDenX) *
                           ((pIVar5->XAxis).Range.Max - dVar6) + dVar6) - dVar6) + (double)IVar4.x);
        fVar14 = (float)(pIVar8->My[iVar10] * (local_88 - pIVar5->YAxis[iVar10].Range.Min) +
                        (double)IVar4.y);
        local_68.y = fVar14;
        local_68.x = fVar13;
        pIVar5 = pIVar7->CurrentPlot;
        fVar15 = (float)local_58._4_4_;
        if (fVar14 <= (float)local_58._4_4_) {
          fVar15 = fVar14;
        }
        if ((fVar15 < (pIVar5->PlotRect).Max.y) &&
           (fVar15 = (float)(~-(uint)(fVar14 <= (float)local_58._4_4_) & (uint)fVar14 |
                            -(uint)(fVar14 <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar5->PlotRect).Min.y, *pfVar1 <= fVar15 && fVar15 != *pfVar1)) {
          fVar15 = (float)local_58._0_4_;
          if (fVar13 <= (float)local_58._0_4_) {
            fVar15 = fVar13;
          }
          if ((fVar15 < (pIVar5->PlotRect).Max.x) &&
             (fVar15 = (float)(-(uint)(fVar13 <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(fVar13 <= (float)local_58._0_4_) & (uint)fVar13),
             (pIVar5->PlotRect).Min.x <= fVar15 && fVar15 != (pIVar5->PlotRect).Min.x)) {
            local_90.y = (float)local_58._4_4_;
            local_90.x = fVar13;
            ImDrawList::AddLine(local_70,(ImVec2 *)local_58,&local_90,col,line_weight);
            transformer = local_60;
            ImDrawList::AddLine(this,&local_90,&local_68,col,line_weight);
          }
        }
        iVar11 = iVar11 + 1;
        iVar10 = getter->Count;
        local_58 = (undefined1  [8])local_68;
      } while (iVar11 < iVar10);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}